

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O3

void __thiscall xmrig::Client::deleteLater(Client *this)

{
  ulong uVar1;
  mapped_type pCVar2;
  int iVar3;
  long lVar4;
  mapped_type *ppCVar5;
  _Base_ptr p_Var6;
  long lVar7;
  iterator __position;
  bool bVar8;
  ulong local_20;
  
  if ((this->super_BaseClient).m_listener != (IClientListener *)0x0) {
    (this->super_BaseClient).m_listener = (IClientListener *)0x0;
    iVar3 = (*(this->super_BaseClient).super_IClient._vptr_IClient[2])();
    if (((char)iVar3 == '\0') && (uVar1 = this->m_key, m_storage._16_8_ != 0)) {
      lVar4 = 0x1ae8e0;
      lVar7 = m_storage._16_8_;
      do {
        bVar8 = *(ulong *)(lVar7 + 0x20) < uVar1;
        if (!bVar8) {
          lVar4 = lVar7;
        }
        lVar7 = *(long *)(lVar7 + 0x10 + (ulong)bVar8 * 8);
      } while (lVar7 != 0);
      __position._M_node = (_Base_ptr)(m_storage + 8);
      if ((lVar4 != 0x1ae8e0) && (*(ulong *)(lVar4 + 0x20) <= uVar1)) {
        local_20 = uVar1;
        ppCVar5 = std::
                  map<unsigned_long,_xmrig::Client_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::Client_*>_>_>
                  ::at((map<unsigned_long,_xmrig::Client_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::Client_*>_>_>
                        *)m_storage,&local_20);
        pCVar2 = *ppCVar5;
        if (pCVar2 != (mapped_type)0x0) {
          p_Var6 = (_Base_ptr)m_storage._16_8_;
          if (m_storage._16_8_ != 0) {
            do {
              if (*(ulong *)(p_Var6 + 1) >= uVar1) {
                __position._M_node = p_Var6;
              }
              p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < uVar1];
            } while (p_Var6 != (_Base_ptr)0x0);
            if ((__position._M_node != (_Base_ptr)(m_storage + 8)) &&
               (*(ulong *)(__position._M_node + 1) <= uVar1)) {
              std::
              _Rb_tree<unsigned_long,std::pair<unsigned_long_const,xmrig::Client*>,std::_Select1st<std::pair<unsigned_long_const,xmrig::Client*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,xmrig::Client*>>>
              ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,xmrig::Client*>,std::_Select1st<std::pair<unsigned_long_const,xmrig::Client*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,xmrig::Client*>>>
                                  *)m_storage,__position);
            }
          }
          (*(pCVar2->super_BaseClient).super_IClient._vptr_IClient[1])(pCVar2);
        }
      }
    }
  }
  return;
}

Assistant:

void xmrig::Client::deleteLater()
{
    if (!m_listener) {
        return;
    }

    m_listener = nullptr;

    if (!disconnect()) {
        m_storage.remove(m_key);
    }
}